

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_01895a30;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01890720,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_01890420;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend(&this->fGeo,nodeindices);
  lVar1 = 0x910;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.
            fNodeIndexes + lVar1 + -0x58) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)(&(this->fGeo).super_TPZGeoTriangle + -2) + lVar1) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.
            fNodeIndexes + lVar1 + -0x50) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x9b8);
  lVar1 = 0x910;
  do {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.
            fNodeIndexes + lVar1 + -0x50) = 0xffffffffffffffff;
    *(undefined4 *)((long)(&(this->fGeo).super_TPZGeoTriangle + -2) + lVar1) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x9b8);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Initialize(&this->fGeo,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}